

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunks.hpp
# Opt level: O0

iterator_range<burst::buffered_chunk_iterator<std::_List_const_iterator<char>,_int>_> * __thiscall
burst::buffered_chunks_t::operator()
          (iterator_range<burst::buffered_chunk_iterator<std::_List_const_iterator<char>,_int>_>
           *__return_storage_ptr__,buffered_chunks_t *this,list<char,_std::allocator<char>_> *args,
          int *args_1)

{
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int> local_100;
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int> local_d0;
  undefined1 local_88 [8];
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int> end;
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int> begin;
  int *args_local_1;
  list<char,_std::allocator<char>_> *args_local;
  buffered_chunks_t *this_local;
  
  make_buffered_chunk_iterator<std::__cxx11::list<char,std::allocator<char>>,int>
            ((buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *)&end.m_chunk_end,
             (burst *)args,(list<char,_std::allocator<char>_> *)(ulong)(uint)*args_1,(int)args_1);
  make_buffered_chunk_iterator<std::_List_const_iterator<char>,int>
            (local_88,(burst *)&end.m_chunk_end);
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int>::buffered_chunk_iterator
            (&local_d0,
             (buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *)&end.m_chunk_end);
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int>::buffered_chunk_iterator
            (&local_100,(buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *)local_88);
  boost::make_iterator_range<burst::buffered_chunk_iterator<std::_List_const_iterator<char>,int>>
            (__return_storage_ptr__,(boost *)&local_d0,&local_100,
             (buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *)args_1);
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int>::~buffered_chunk_iterator
            (&local_100);
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int>::~buffered_chunk_iterator(&local_d0)
  ;
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int>::~buffered_chunk_iterator
            ((buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *)local_88);
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int>::~buffered_chunk_iterator
            ((buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *)&end.m_chunk_end);
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_buffered_chunk_iterator(std::forward<Args>(args)...);
            auto end = make_buffered_chunk_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }